

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen1_2x3.cpp
# Opt level: O0

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcRelFillsElement>
                 (DB *db,LIST *params,IfcRelFillsElement *in)

{
  size_t sVar1;
  TypeError *this;
  TypeError *t_1;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_1;
  TypeError *t;
  undefined1 local_70 [8];
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg;
  allocator local_49;
  string local_48;
  size_t local_28;
  size_t base;
  IfcRelFillsElement *in_local;
  LIST *params_local;
  DB *db_local;
  
  base = (size_t)in;
  in_local = (IfcRelFillsElement *)params;
  params_local = (LIST *)db;
  local_28 = GenericFill<Assimp::IFC::Schema_2x3::IfcRelConnects>
                       (db,params,&in->super_IfcRelConnects);
  sVar1 = EXPRESS::LIST::GetSize((LIST *)in_local);
  if (5 < sVar1) {
    local_28 = local_28 + 1;
    EXPRESS::LIST::operator[]((LIST *)local_70,(size_t)in_local);
    GenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcOpeningElement>>
              ((Lazy<Assimp::IFC::Schema_2x3::IfcOpeningElement> *)(base + 0xb8),
               (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70,(DB *)params_local);
    std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
              ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70);
    local_28 = local_28 + 1;
    EXPRESS::LIST::operator[]((LIST *)&t_1,(size_t)in_local);
    GenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcElement>>
              ((Lazy<Assimp::IFC::Schema_2x3::IfcElement> *)(base + 0xc0),
               (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_1,(DB *)params_local);
    std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
              ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_1);
    return local_28;
  }
  arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._3_1_ = 1;
  this = (TypeError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"expected 6 arguments to IfcRelFillsElement",&local_49);
  TypeError::TypeError(this,&local_48,0xffffffffffffffff,0xffffffffffffffff);
  arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._3_1_ = 0;
  __cxa_throw(this,&TypeError::typeinfo,TypeError::~TypeError);
}

Assistant:

size_t GenericFill<IfcRelFillsElement>(const DB& db, const LIST& params, IfcRelFillsElement* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcRelConnects*>(in));
	if (params.GetSize() < 6) { throw STEP::TypeError("expected 6 arguments to IfcRelFillsElement"); }    do { // convert the 'RelatingOpeningElement' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->RelatingOpeningElement, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 4 to IfcRelFillsElement to be a `IfcOpeningElement`")); }
    } while(0);
    do { // convert the 'RelatedBuildingElement' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->RelatedBuildingElement, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 5 to IfcRelFillsElement to be a `IfcElement`")); }
    } while(0);
	return base;
}